

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutahedral_representation_iterators.h
# Opt level: O0

void __thiscall
Gudhi::coxeter_triangulation::
Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
::update_value(Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               *this)

{
  uint uVar1;
  bool bVar2;
  Vertex *pVVar3;
  Vertex *this_00;
  OrderedSetPartition *pOVar4;
  reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  reference pOVar8;
  reference puVar9;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  iterator __first;
  iterator __last;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *part;
  iterator __end0_1;
  iterator __begin0_1;
  OrderedSetPartition *__range3_1;
  const_iterator cStack_140;
  uint b_2;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4_1;
  uint j_2;
  uint b_1;
  const_iterator __end5;
  const_iterator __begin5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range5;
  uint j_1;
  uint h;
  uint local_c8;
  uint local_c4;
  uint c;
  uint b;
  const_iterator __end4;
  const_iterator __begin4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  uint local_88;
  uint j;
  uint i;
  uint *local_68;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_60;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  undefined1 local_50 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> range;
  uint u_;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *p;
  iterator __end0;
  iterator __begin0;
  OrderedSetPartition *__range3;
  Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *this_local;
  
  pVVar3 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::vertex(&this->simplex_);
  this_00 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ::vertex(&this->value_);
  std::vector<int,_std::allocator<int>_>::operator=(this_00,pVVar3);
  pOVar4 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::partition(&this->value_);
  __end0 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::begin(pOVar4);
  p = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::end(pOVar4);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                     *)&p), bVar2) {
    pvVar14 = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::operator*(&__end0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(pvVar14);
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::operator++(&__end0);
  }
  range.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  while( true ) {
    uVar1 = range.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    pvVar5 = boost::iterators::detail::
             iterator_facade_base<Gudhi::coxeter_triangulation::Integer_combination_iterator,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_long,_false,_false>
             ::operator*((iterator_facade_base<Gudhi::coxeter_triangulation::Integer_combination_iterator,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_long,_false,_false>
                          *)&this->i_it_);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (pvVar5,(ulong)this->k_);
    if (*pvVar6 < uVar1) break;
    pvVar7 = std::
             vector<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
             ::operator[](&this->o_its_,(ulong)this->k_);
    pOVar8 = boost::iterators::detail::
             iterator_facade_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_const_Gudhi::coxeter_triangulation::Ordered_set_partition,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Ordered_set_partition_&,_long,_false,_false>
             ::operator*((iterator_facade_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_const_Gudhi::coxeter_triangulation::Ordered_set_partition,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Ordered_set_partition_&,_long,_false,_false>
                          *)pvVar7);
    Ordered_set_partition::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,pOVar8,
               (uint *)((long)&range.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    local_60._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
    local_68 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
    local_58 = std::
               find<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                         (local_60,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                    )local_68,&this->t_);
    _i = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
    bVar2 = __gnu_cxx::operator!=
                      (&local_58,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&i);
    if (bVar2) {
      j = 4;
    }
    else {
      j = 0;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
    if (j != 0) break;
    range.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         range.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  local_88 = 0;
  __range4._4_4_ =
       range.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_;
  while( true ) {
    __range4._4_4_ = __range4._4_4_ + 1;
    uVar1 = __range4._4_4_;
    pvVar5 = boost::iterators::detail::
             iterator_facade_base<Gudhi::coxeter_triangulation::Integer_combination_iterator,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_long,_false,_false>
             ::operator*((iterator_facade_base<Gudhi::coxeter_triangulation::Integer_combination_iterator,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_long,_false,_false>
                          *)&this->i_it_);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (pvVar5,(ulong)this->k_);
    if (*pvVar6 < uVar1) break;
    pvVar7 = std::
             vector<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
             ::operator[](&this->o_its_,(ulong)this->k_);
    pOVar8 = boost::iterators::detail::
             iterator_facade_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_const_Gudhi::coxeter_triangulation::Ordered_set_partition,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Ordered_set_partition_&,_long,_false,_false>
             ::operator*((iterator_facade_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_const_Gudhi::coxeter_triangulation::Ordered_set_partition,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Ordered_set_partition_&,_long,_false,_false>
                          *)pvVar7);
    Ordered_set_partition::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin4,pOVar8,
               (uint *)((long)&__range4 + 4));
    __end4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin4);
    _c = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin4);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       *)&c), bVar2) {
      puVar9 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end4);
      local_c4 = *puVar9;
      pOVar4 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::partition(&this->simplex_);
      pvVar10 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator[](pOVar4,(ulong)this->k_);
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (pvVar10,(ulong)local_c4);
      local_c8 = (uint)*pvVar11;
      pOVar4 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::partition(&this->value_);
      pvVar10 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator[](pOVar4,(ulong)local_88);
      _j_1 = (ulong)local_c8;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (pvVar10,(value_type_conflict1 *)&j_1);
      pVVar3 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::vertex(&this->value_);
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](pVVar3,(ulong)local_c8);
      *pvVar12 = *pvVar12 + -1;
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end4);
    }
    j = 10;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin4);
    local_88 = local_88 + 1;
  }
  for (__range5._4_4_ = 0; __range5._4_4_ < this->k_; __range5._4_4_ = __range5._4_4_ + 1) {
    __range5._0_4_ = 0;
    while( true ) {
      uVar1 = (uint)__range5;
      pvVar5 = boost::iterators::detail::
               iterator_facade_base<Gudhi::coxeter_triangulation::Integer_combination_iterator,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_long,_false,_false>
               ::operator*((iterator_facade_base<Gudhi::coxeter_triangulation::Integer_combination_iterator,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_long,_false,_false>
                            *)&this->i_it_);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar5,(ulong)__range5._4_4_);
      if (*pvVar6 < uVar1) break;
      pvVar7 = std::
               vector<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
               ::operator[](&this->o_its_,(ulong)__range5._4_4_);
      pOVar8 = boost::iterators::detail::
               iterator_facade_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_const_Gudhi::coxeter_triangulation::Ordered_set_partition,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Ordered_set_partition_&,_long,_false,_false>
               ::operator*((iterator_facade_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_const_Gudhi::coxeter_triangulation::Ordered_set_partition,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Ordered_set_partition_&,_long,_false,_false>
                            *)pvVar7);
      Ordered_set_partition::operator[]
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin5,pOVar8,
                 (uint *)&__range5);
      __end5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin5);
      _j_2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin5);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end5,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                         *)&j_2), bVar2) {
        puVar9 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end5);
        __range4_1._4_4_ = *puVar9;
        pOVar4 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 ::partition(&this->value_);
        pvVar10 = std::
                  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::operator[](pOVar4,(ulong)local_88);
        pOVar4 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 ::partition(&this->simplex_);
        pvVar13 = std::
                  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::operator[](pOVar4,(ulong)__range5._4_4_);
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (pvVar13,(ulong)__range4_1._4_4_);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(pvVar10,pvVar11);
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end5);
      }
      j = 0x12;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin5);
      __range5._0_4_ = (uint)__range5 + 1;
      local_88 = local_88 + 1;
    }
  }
  for (__range4_1._0_4_ = 0;
      (uint)__range4_1 <=
      range.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; __range4_1._0_4_ = (uint)__range4_1 + 1) {
    pvVar7 = std::
             vector<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
             ::operator[](&this->o_its_,(ulong)this->k_);
    pOVar8 = boost::iterators::detail::
             iterator_facade_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_const_Gudhi::coxeter_triangulation::Ordered_set_partition,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Ordered_set_partition_&,_long,_false,_false>
             ::operator*((iterator_facade_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_const_Gudhi::coxeter_triangulation::Ordered_set_partition,_boost::iterators::forward_traversal_tag,_const_Gudhi::coxeter_triangulation::Ordered_set_partition_&,_long,_false,_false>
                          *)pvVar7);
    Ordered_set_partition::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin4_1,pOVar8,
               (uint *)&__range4_1);
    __end4_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin4_1);
    cStack_140 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin4_1);
    while (bVar2 = __gnu_cxx::operator!=(&__end4_1,&stack0xfffffffffffffec0), bVar2) {
      puVar9 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end4_1);
      uVar1 = *puVar9;
      pOVar4 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::partition(&this->value_);
      pvVar10 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator[](pOVar4,(ulong)local_88);
      pOVar4 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::partition(&this->simplex_);
      pvVar13 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator[](pOVar4,(ulong)this->k_);
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (pvVar13,(ulong)uVar1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(pvVar10,pvVar11);
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end4_1);
    }
    j = 0x17;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin4_1);
    local_88 = local_88 + 1;
  }
  pOVar4 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::partition(&this->value_);
  __end0_1 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::begin(pOVar4);
  part = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
         std::
         vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ::end(pOVar4);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end0_1,
                            (__normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                             *)&part), bVar2) {
    pvVar14 = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::operator*(&__end0_1);
    __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(pvVar14);
    __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(pvVar14);
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )__first._M_current,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )__last._M_current);
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::operator++(&__end0_1);
  }
  return;
}

Assistant:

void update_value() {
    value_.vertex() = simplex_.vertex();
    for (auto& p : value_.partition()) p.clear();
    uint u_ = 0;  // the part in o_its_[k_] that contains t_
    for (; u_ <= (*i_it_)[k_]; u_++) {
      auto range = (*o_its_[k_])[u_];
      if (std::find(range.begin(), range.end(), t_) != range.end()) break;
    }
    uint i = 0;
    for (uint j = u_ + 1; j <= (*i_it_)[k_]; j++, i++)
      for (uint b : (*o_its_[k_])[j]) {
        uint c = simplex_.partition()[k_][b];
        value_.partition()[i].push_back(c);
        value_.vertex()[c]--;
      }
    for (uint h = 0; h < k_; h++)
      for (uint j = 0; j <= (*i_it_)[h]; j++, i++) {
        for (uint b : (*o_its_[h])[j]) value_.partition()[i].push_back(simplex_.partition()[h][b]);
      }
    for (uint j = 0; j <= u_; j++, i++)
      for (uint b : (*o_its_[k_])[j]) value_.partition()[i].push_back(simplex_.partition()[k_][b]);
    // sort the values in each part (probably not needed)
    for (auto& part : value_.partition()) std::sort(part.begin(), part.end());
  }